

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O1

int run_test_fs_event_watch_file_twice(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 extraout_RAX;
  undefined8 in_R9;
  char path [25];
  uv_timer_t timer;
  uv_fs_event_t watchers [2];
  char acStack_1e8 [40];
  uv_timer_t local_1c0;
  uv_fs_event_t local_128;
  uv_fs_event_t local_a0;
  
  builtin_strncpy(acStack_1e8 + 0x10,"pty_file",9);
  builtin_strncpy(acStack_1e8,"test/fixtures/em",0x10);
  puVar2 = uv_default_loop();
  local_1c0.data = &local_128;
  iVar1 = uv_fs_event_init(puVar2,(uv_fs_event_t *)local_1c0.data);
  if (iVar1 == 0) {
    iVar1 = uv_fs_event_start(&local_128,fail_cb,acStack_1e8,0);
    if (iVar1 != 0) goto LAB_0014e730;
    iVar1 = uv_fs_event_init(puVar2,&local_a0);
    if (iVar1 != 0) goto LAB_0014e735;
    iVar1 = uv_fs_event_start(&local_a0,fail_cb,acStack_1e8,0);
    if (iVar1 != 0) goto LAB_0014e73a;
    iVar1 = uv_timer_init(puVar2,&local_1c0);
    if (iVar1 != 0) goto LAB_0014e73f;
    iVar1 = uv_timer_start(&local_1c0,timer_cb_watch_twice,10,0);
    if (iVar1 != 0) goto LAB_0014e744;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014e74e;
    }
  }
  else {
    run_test_fs_event_watch_file_twice_cold_1();
LAB_0014e730:
    run_test_fs_event_watch_file_twice_cold_2();
LAB_0014e735:
    run_test_fs_event_watch_file_twice_cold_3();
LAB_0014e73a:
    run_test_fs_event_watch_file_twice_cold_4();
LAB_0014e73f:
    run_test_fs_event_watch_file_twice_cold_5();
LAB_0014e744:
    run_test_fs_event_watch_file_twice_cold_6();
  }
  run_test_fs_event_watch_file_twice_cold_7();
LAB_0014e74e:
  run_test_fs_event_watch_file_twice_cold_8();
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-event.c"
          ,0x81,"0 && \"fail_cb called\"",in_R9,extraout_RAX);
  abort();
}

Assistant:

TEST_IMPL(fs_event_watch_file_twice) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  const char path[] = "test/fixtures/empty_file";
  uv_fs_event_t watchers[2];
  uv_timer_t timer;
  uv_loop_t* loop;

  loop = uv_default_loop();
  timer.data = watchers;

  ASSERT(0 == uv_fs_event_init(loop, watchers + 0));
  ASSERT(0 == uv_fs_event_start(watchers + 0, fail_cb, path, 0));
  ASSERT(0 == uv_fs_event_init(loop, watchers + 1));
  ASSERT(0 == uv_fs_event_start(watchers + 1, fail_cb, path, 0));
  ASSERT(0 == uv_timer_init(loop, &timer));
  ASSERT(0 == uv_timer_start(&timer, timer_cb_watch_twice, 10, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  MAKE_VALGRIND_HAPPY();
  return 0;
}